

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_file.c
# Opt level: O1

int64_t FILE_skip(archive *a,void *client_data,int64_t request)

{
  uint uVar1;
  __off_t _Var2;
  int64_t iVar3;
  off_t skip;
  read_FILE_data *mine;
  
  iVar3 = 0;
  if ((request != 0) && (*(char *)((long)client_data + 0x20) != '\0')) {
    _Var2 = ftello(*client_data);
    if ((_Var2 < 0) ||
       ((*(long *)((long)client_data + 0x10) - _Var2 < request ||
         *(long *)((long)client_data + 0x10) <= _Var2 ||
        (uVar1 = fseeko(*client_data,request,1), (int)uVar1 < 0)))) {
      *(undefined1 *)((long)client_data + 0x20) = 0;
      iVar3 = 0;
    }
    else {
      iVar3 = (ulong)uVar1 - _Var2;
    }
  }
  return iVar3;
}

Assistant:

static int64_t
FILE_skip(struct archive *a, void *client_data, int64_t request)
{
	struct read_FILE_data *mine = (struct read_FILE_data *)client_data;
#if HAVE__FSEEKI64
	int64_t skip = request;
#elif HAVE_FSEEKO
	off_t skip = (off_t)request;
#else
	long skip = (long)request;
#endif
	int64_t old_offset, new_offset;
	int skip_bits = sizeof(skip) * 8 - 1;

	(void)a; /* UNUSED */

	/*
	 * If we can't skip, return 0 as the amount we did step and
	 * the caller will work around by reading and discarding.
	 */
	if (!mine->can_skip)
		return (0);
	if (request == 0)
		return (0);

	/* If request is too big for a long or an off_t, reduce it. */
	if (sizeof(request) > sizeof(skip)) {
		const int64_t max_skip =
		    (((int64_t)1 << (skip_bits - 1)) - 1) * 2 + 1;
		if (request > max_skip)
			skip = max_skip;
	}

#ifdef __ANDROID__
        /* fileno() isn't safe on all platforms ... see above. */
	old_offset = lseek(fileno(mine->f), 0, SEEK_CUR);
#elif HAVE__FSEEKI64
	old_offset = _ftelli64(mine->f);
#elif HAVE_FSEEKO
	old_offset = ftello(mine->f);
#else
	old_offset = ftell(mine->f);
#endif
	if (old_offset >= 0) {
		if (old_offset < mine->size &&
		    skip <= mine->size - old_offset) {
#ifdef __ANDROID__
			new_offset = lseek(fileno(mine->f), skip, SEEK_CUR);
#elif HAVE__FSEEKI64
			new_offset = _fseeki64(mine->f, skip, SEEK_CUR);
#elif HAVE_FSEEKO
			new_offset = fseeko(mine->f, skip, SEEK_CUR);
#else
			new_offset = fseek(mine->f, skip, SEEK_CUR);
#endif
			if (new_offset >= 0)
				return (new_offset - old_offset);
		}
	}

	mine->can_skip = 0;
	return (0);
}